

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# robin_hash.h
# Opt level: O0

void __thiscall
tsl::detail_robin_hash::
bucket_entry<std::pair<unsigned_long,_ImputedData<unsigned_long,_double>_>,_false>::
swap_with_value_in_bucket
          (bucket_entry<std::pair<unsigned_long,_ImputedData<unsigned_long,_double>_>,_false> *this,
          distance_type *dist_from_ideal_bucket,truncated_hash_type *hash,value_type *value)

{
  pair<unsigned_long,_ImputedData<unsigned_long,_double>_> *in_RCX;
  short *in_RSI;
  short *in_RDI;
  pair<unsigned_long,_ImputedData<unsigned_long,_double>_> *in_stack_ffffffffffffffc8;
  
  bucket_entry<std::pair<unsigned_long,_ImputedData<unsigned_long,_double>_>,_false>::value
            ((bucket_entry<std::pair<unsigned_long,_ImputedData<unsigned_long,_double>_>,_false> *)
             0x3bfe01);
  std::swap<unsigned_long,ImputedData<unsigned_long,double>>(in_RCX,in_stack_ffffffffffffffc8);
  std::swap<short>(in_RSI,in_RDI);
  return;
}

Assistant:

void swap_with_value_in_bucket(distance_type& dist_from_ideal_bucket,
                                 truncated_hash_type& hash, value_type& value) {
    tsl_rh_assert(!empty());
    tsl_rh_assert(dist_from_ideal_bucket > m_dist_from_ideal_bucket);

    using std::swap;
    swap(value, this->value());
    swap(dist_from_ideal_bucket, m_dist_from_ideal_bucket);

    if (StoreHash) {
      const truncated_hash_type tmp_hash = this->truncated_hash();
      this->set_hash(hash);
      hash = tmp_hash;
    } else {
      // Avoid warning of unused variable if StoreHash is false
      TSL_RH_UNUSED(hash);
    }
  }